

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.hpp
# Opt level: O3

void __thiscall
test_impl::R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>::
oops<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *u)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  char local_1c [4];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"> ERROR: CHECK failed \"",0x17);
  pcVar1 = *(char **)(this + 8);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x110100);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"> \t",3);
  pcVar1 = *(char **)this;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x110100);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar2);
  }
  local_1c[0] = '(';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1c,1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,*(int *)(this + 0x20));
  local_1c[1] = 0x29;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1c + 1,1);
  local_1c[2] = 10;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1c + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"> \t in function \"",0x11);
  pcVar1 = *(char **)(this + 0x10);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
  if (this[0x24] == (R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>)0x1)
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"> \tEXPECTED: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"<non-streamable type>",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n> \tACTUAL: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"<non-streamable type>",0x15);
    local_1c[3] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1c + 3,1);
  }
  test_failures()::test_failures = test_failures()::test_failures + 1;
  return;
}

Assistant:

void oops(U const &u) const
        {
            std::cerr
                << "> ERROR: CHECK failed \"" << expr_ << "\"\n"
                << "> \t" << filename_ << '(' << lineno_ << ')' << '\n'
                << "> \t in function \"" << func_ << "\"\n";
            if(dismissed_)
                std::cerr
                    << "> \tEXPECTED: " << stream(u) << "\n> \tACTUAL: " << stream(t_) << '\n';
            ++test_failures();
        }